

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Cluster::Finalize(Cluster *this,bool set_last_frame_duration,uint64_t duration)

{
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *this_00;
  Frame *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  _List_node_base *p_Var9;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  Frame *frame;
  uint64_t local_50;
  undefined4 local_44;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_40;
  uint64_t local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,set_last_frame_duration);
  if ((this->writer_ != (IMkvWriter *)0x0) && (this->finalized_ == false)) {
    local_38 = duration;
    if (this->write_last_frame_with_duration_ == true) {
      this_00 = &this->stored_frames_;
      local_40 = &this->last_block_timestamp_;
      do {
        if ((this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
        goto LAB_0014f9a7;
        p_Var6 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        frame = (Frame *)(p_Var6[1]._M_parent)->_M_left;
        while (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6),
              (_Rb_tree_header *)p_Var6 !=
              &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header) {
          pFVar1 = (Frame *)(p_Var6[1]._M_parent)->_M_left;
          if (pFVar1->timestamp_ < frame->timestamp_) {
            frame = pFVar1;
          }
        }
        if ((char)local_44 != '\0') {
          local_50 = frame->track_number_;
          pmVar7 = std::
                   map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                   ::operator[](this_00,&local_50);
          if (((pmVar7->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
               _M_impl._M_node._M_size == 1) && (frame->duration_set_ == false)) {
            frame->duration_ = local_38 - frame->timestamp_;
            frame->duration_set_ = true;
            if ((frame->is_key_ == false) && (frame->reference_block_timestamp_set_ == false)) {
              local_50 = frame->track_number_;
              pmVar8 = std::
                       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       ::operator[](local_40,&local_50);
              frame->reference_block_timestamp_ = *pmVar8;
              frame->reference_block_timestamp_set_ = true;
            }
          }
        }
        bVar2 = DoWriteFrame(this,frame);
        local_50 = frame->track_number_;
        pmVar7 = std::
                 map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                 ::operator[](this_00,&local_50);
        std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::pop_front(pmVar7)
        ;
        local_50 = frame->track_number_;
        p_Var9 = (_List_node_base *)
                 std::
                 map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                 ::operator[](this_00,&local_50);
        if ((((_List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)&p_Var9->_M_next)
            ->_M_impl)._M_node.super__List_node_base._M_next == p_Var9) {
          local_50 = frame->track_number_;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
          ::erase(&this_00->_M_t,&local_50);
        }
        Frame::~Frame(frame);
        operator_delete(frame);
      } while (bVar2);
    }
    else {
LAB_0014f9a7:
      if (this->size_position_ != -1) {
        iVar3 = (*this->writer_->_vptr_IMkvWriter[3])();
        if ((char)iVar3 != '\0') {
          iVar3 = (*this->writer_->_vptr_IMkvWriter[1])();
          iVar4 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,this->size_position_);
          if (iVar4 != 0) {
            return false;
          }
          iVar5 = WriteUIntSize(this->writer_,this->payload_size_,8);
          if (iVar5 != 0) {
            return false;
          }
          iVar3 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,CONCAT44(extraout_var,iVar3));
          if (iVar3 != 0) {
            return false;
          }
        }
        this->finalized_ = true;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Cluster::Finalize(bool set_last_frame_duration, uint64_t duration) {
  if (!writer_ || finalized_)
    return false;

  if (write_last_frame_with_duration_) {
    // Write out held back Frames. This essentially performs a k-way merge
    // across all tracks in the increasing order of timestamps.
    while (!stored_frames_.empty()) {
      Frame* frame = stored_frames_.begin()->second.front();

      // Get the next frame to write (frame with least timestamp across all
      // tracks).
      for (FrameMapIterator frames_iterator = ++stored_frames_.begin();
           frames_iterator != stored_frames_.end(); ++frames_iterator) {
        if (frames_iterator->second.front()->timestamp() < frame->timestamp()) {
          frame = frames_iterator->second.front();
        }
      }

      // Set the duration if it's the last frame for the track.
      if (set_last_frame_duration &&
          stored_frames_[frame->track_number()].size() == 1 &&
          !frame->duration_set()) {
        frame->set_duration(duration - frame->timestamp());
        if (!frame->is_key() && !frame->reference_block_timestamp_set()) {
          frame->set_reference_block_timestamp(
              last_block_timestamp_[frame->track_number()]);
        }
      }

      // Write the frame and remove it from |stored_frames_|.
      const bool wrote_frame = DoWriteFrame(frame);
      stored_frames_[frame->track_number()].pop_front();
      if (stored_frames_[frame->track_number()].empty()) {
        stored_frames_.erase(frame->track_number());
      }
      delete frame;
      if (!wrote_frame)
        return false;
    }
  }

  if (size_position_ == -1)
    return false;

  if (writer_->Seekable()) {
    const int64_t pos = writer_->Position();

    if (writer_->Position(size_position_))
      return false;

    if (WriteUIntSize(writer_, payload_size(), 8))
      return false;

    if (writer_->Position(pos))
      return false;
  }

  finalized_ = true;

  return true;
}